

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

Scalar * __thiscall
Eigen::SparseMatrix<float,_1,_int>::insertBackUncompressed
          (SparseMatrix<float,_1,_int> *this,Index row,Index col)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  StorageIndex SVar4;
  char *__s;
  StorageIndex *pSVar5;
  Scalar *pSVar6;
  int __c;
  Index p;
  Index inner;
  Index outer;
  Index col_local;
  Index row_local;
  SparseMatrix<float,_1,_int> *this_local;
  
  bVar3 = SparseCompressedBase<Eigen::SparseMatrix<float,_1,_int>_>::isCompressed
                    (&this->super_SparseCompressedBase<Eigen::SparseMatrix<float,_1,_int>_>);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isCompressed()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/SparseCore/SparseMatrix.h"
                  ,899,
                  "Scalar &Eigen::SparseMatrix<float, 1>::insertBackUncompressed(Index, Index) [_Scalar = float, _Options = 1, _StorageIndex = int]"
                 );
  }
  if (this->m_innerNonZeros[row] <= this->m_outerIndex[row + 1] - this->m_outerIndex[row]) {
    iVar1 = this->m_outerIndex[row];
    iVar2 = this->m_innerNonZeros[row];
    this->m_innerNonZeros[row] = iVar2 + 1;
    __s = (char *)(long)(iVar1 + iVar2);
    SVar4 = SparseMatrixBase<Eigen::SparseMatrix<float,_1,_int>_>::convert_index(col);
    pSVar5 = (StorageIndex *)internal::CompressedStorage<float,_int>::index(&this->m_data,__s,__c);
    *pSVar5 = SVar4;
    pSVar6 = internal::CompressedStorage<float,_int>::value(&this->m_data,(Index)__s);
    *pSVar6 = 0.0;
    return pSVar6;
  }
  __assert_fail("m_innerNonZeros[outer]<=(m_outerIndex[outer+1] - m_outerIndex[outer])",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/SparseCore/SparseMatrix.h"
                ,900,
                "Scalar &Eigen::SparseMatrix<float, 1>::insertBackUncompressed(Index, Index) [_Scalar = float, _Options = 1, _StorageIndex = int]"
               );
}

Assistant:

EIGEN_STRONG_INLINE Scalar& insertBackUncompressed(Index row, Index col)
    {
      const Index outer = IsRowMajor ? row : col;
      const Index inner = IsRowMajor ? col : row;

      eigen_assert(!isCompressed());
      eigen_assert(m_innerNonZeros[outer]<=(m_outerIndex[outer+1] - m_outerIndex[outer]));

      Index p = m_outerIndex[outer] + m_innerNonZeros[outer]++;
      m_data.index(p) = convert_index(inner);
      return (m_data.value(p) = Scalar(0));
    }